

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

CharacterCounts __thiscall
ON_XMLNode::WriteFooterToStream
          (ON_XMLNode *this,wchar_t *stream,ON__UINT32 max_chars,bool includeFormatting,
          bool forceLongFormat)

{
  CharacterCounts CVar1;
  wchar_t *__dest;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  uint *puVar5;
  wchar_t *__src;
  uint local_64;
  uint local_60;
  int local_5c;
  uint chars_to_copy;
  int depth;
  ON_wString footer;
  ON_wString local_40;
  byte local_35;
  int local_34;
  byte local_2e;
  bool hasDefaultProp;
  int child_count;
  bool forceLongFormat_local;
  bool includeFormatting_local;
  wchar_t *pwStack_28;
  ON__UINT32 max_chars_local;
  wchar_t *stream_local;
  ON_XMLNode *this_local;
  CharacterCounts counts;
  
  local_2e = forceLongFormat;
  hasDefaultProp = includeFormatting;
  child_count = max_chars;
  pwStack_28 = stream;
  stream_local = (wchar_t *)this;
  local_34 = (*this->_vptr_ON_XMLNode[0x22])();
  iVar3 = (*this->_vptr_ON_XMLNode[0x27])();
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))();
  (**(code **)(*plVar4 + 0x168))();
  bVar2 = ON_wString::IsNotEmpty(&local_40);
  ON_wString::~ON_wString(&local_40);
  local_35 = bVar2;
  ON_wString::ON_wString((ON_wString *)&chars_to_copy);
  if ((((local_35 & 1) == 0) && (local_34 < 1)) && ((local_2e & 1) == 0)) {
    ON_wString::operator=((ON_wString *)&chars_to_copy,L"/>");
    if ((hasDefaultProp & 1U) != 0) {
      ON_wString::operator+=((ON_wString *)&chars_to_copy,L"\r\n");
    }
  }
  else {
    ON_wString::operator=((ON_wString *)&chars_to_copy,L"</");
    ON_wString::operator+=((ON_wString *)&chars_to_copy,&this->_private->m_name);
    ON_wString::operator+=((ON_wString *)&chars_to_copy,L'>');
    if ((((hasDefaultProp & 1U) != 0) &&
        (ON_wString::operator+=((ON_wString *)&chars_to_copy,L"\r\n"), 0 < local_34)) &&
       (local_5c = (*this->_vptr_ON_XMLNode[0x23])(), 0 < local_5c)) {
      ON_wString::Insert((ON_wString *)&chars_to_copy,0,L'\t',local_5c);
    }
  }
  CharacterCounts::CharacterCounts((CharacterCounts *)&this_local);
  this_local._0_4_ = ON_wString::Length((ON_wString *)&chars_to_copy);
  if (child_count != 0) {
    local_64 = (int)this_local + 1;
    puVar5 = std::min<unsigned_int>((uint *)&child_count,&local_64);
    __dest = pwStack_28;
    local_60 = *puVar5;
    __src = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&chars_to_copy);
    memcpy(__dest,__src,(ulong)local_60 << 2);
    puVar5 = std::min<unsigned_int>((uint *)&child_count,(uint *)&this_local);
    this_local._4_4_ = *puVar5;
  }
  ON_wString::~ON_wString((ON_wString *)&chars_to_copy);
  CVar1._physical = this_local._4_4_;
  CVar1._logical = (int)this_local;
  CVar1._reserved._0_4_ = counts._logical;
  CVar1._reserved._4_4_ = counts._physical;
  return CVar1;
}

Assistant:

ON_XMLNode::CharacterCounts ON_XMLNode::WriteFooterToStream(wchar_t* stream, ON__UINT32 max_chars, bool includeFormatting, bool forceLongFormat) const
{
  const auto child_count = ChildCount();
  const bool hasDefaultProp = GetDefaultProperty().GetValue().AsString().IsNotEmpty();

  ON_wString footer;

  if (hasDefaultProp || (child_count > 0) || forceLongFormat)
  {
    footer = L"</";
    footer += _private->m_name;
    footer += L'>';

    if (includeFormatting)
    {
      footer += L"\r\n";

      if (child_count > 0)
      {
        const int depth = GetNestedDepth();
        if (depth > 0)
        {
          footer.Insert(0, L'\t', depth);
        }
      }
    }
  }
  else
  {
    footer = L"/>";
    if (includeFormatting)
      footer += L"\r\n";
  }

  CharacterCounts counts;
  counts._logical = ON__UINT32(footer.Length());

  if (0 != max_chars)
  {
    const auto chars_to_copy = std::min(max_chars, counts._logical + 1);
    memcpy(stream, static_cast<const wchar_t*>(footer), chars_to_copy * sizeof(wchar_t));
    counts._physical = std::min(max_chars, counts._logical);
  }

  return counts;
}